

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::PeekAndCheckType(TypeChecker *this,Index depth,Type expected)

{
  Result RVar1;
  Result RVar2;
  Type actual;
  Type in_stack_ffffffffffffffd8;
  Type local_20;
  
  local_20.enum_ = Any;
  local_20.type_index_ = 0xffffffff;
  RVar1 = PeekType(this,depth,&local_20);
  RVar2 = CheckType(in_stack_ffffffffffffffd8,(Type)0x17f954);
  RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::PeekAndCheckType(Index depth, Type expected) {
  Type actual = Type::Any;
  Result result = PeekType(depth, &actual);
  return result | CheckType(actual, expected);
}